

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::hash_set_cs_ext::merge(hash_set_cs_ext *this,hash_set *lhs,hash_set *rhs)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  anon_union_8_1_a8a14541_for_iterator_1 args;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *this_00;
  size_t sVar3;
  const_iterator __begin2;
  iterator local_58;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>::iterator,_bool>
  local_48;
  
  any::
  make<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&>
            ((any *)this,lhs);
  this_00 = &any::
             val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                       ((any *)this)->
             super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  ;
  local_58 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
             ::begin(&rhs->
                      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                    );
  pcVar1 = (rhs->
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
           ).ctrl_;
  sVar2 = (rhs->
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ).capacity_;
  while (local_58.ctrl_ != pcVar1 + sVar2) {
    args = local_58.field_1;
    sVar3 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
            ::count<cs_impl::any>(this_00,local_58.field_1.slot_);
    if (sVar3 == 0) {
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::emplace<const_cs_impl::any_&,_0>(&local_48,this_00,args.slot_);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
    ::iterator::operator++(&local_58);
  }
  return (var)(proxy *)this;
}

Assistant:

var merge(const hash_set &lhs, const hash_set &rhs)
		{
			var ret = var::make<hash_set>(lhs);
			hash_set &s = ret.val<hash_set>();
			for (auto &it: rhs) {
				if (s.count(it) == 0)
					s.emplace(it);
			}
			return ret;
		}